

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::eval
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          vector<double,_std::allocator<double>_> *v)

{
  id_type iVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  numeric_type nVar5;
  
  if (this->id_ < (ulong)(*(long *)(v + 8) - *(long *)v >> 3)) {
    nVar5 = rt_variable<viennamath::rt_expression_interface<double>>::operator()
                      ((rt_variable<viennamath::rt_expression_interface<double>> *)this,v);
    return nVar5;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
  iVar1 = this->id_;
  lVar2 = *(long *)(v + 8);
  lVar3 = *(long *)v;
  *puVar4 = &PTR__exception_00112970;
  puVar4[1] = iVar1;
  puVar4[2] = lVar2 - lVar3 >> 3;
  __cxa_throw(puVar4,&variable_index_out_of_bounds_exception::typeinfo,std::exception::~exception);
}

Assistant:

numeric_type eval(std::vector<double> const & v) const
      {
        if (id_ >= v.size())
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), static_cast<long>(v.size()));

        return (*this)(v);
      }